

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  string *this;
  _Alloc_hider _Var7;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int num_bit;
  int output;
  double absolute_maximum_value;
  UniformQuantization uniform_quantization;
  double input;
  ostringstream error_message_6;
  ifstream ifs;
  int local_41c;
  QuantizationType local_418;
  int local_414;
  double local_410;
  string local_408;
  ulong local_3e8;
  undefined1 local_3e0 [40];
  double local_3b8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_410 = 32768.0;
  local_41c = 8;
  local_3e8 = 0;
  local_418 = kMidRise;
LAB_0010372f:
  while (iVar4 = ya_getopt_long(argc,argv,"v:b:t:o:h",(option *)0x0,(int *)0x0), iVar4 < 0x6f) {
    if (iVar4 != 0x62) {
      if (iVar4 != -1) {
        if (iVar4 == 0x68) {
          anon_unknown.dwarf_1ec7::PrintUsage((ostream *)&std::cout);
          return 0;
        }
        goto LAB_00103989;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Too many input files",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"quantize","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_00103b7b;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this = &local_238;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Cannot set translation mode",0x1b);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"quantize","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_00103b7b;
      }
      std::ifstream::ifstream(this);
      if ((__s != (char *)0x0) &&
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar5);
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_3e0 + 0x10);
        local_3e0._0_8_ = paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"quantize","");
        sptk::PrintErrorMessage((string *)local_3e0,(ostringstream *)local_3b0);
        _Var7._M_p = (pointer)local_3e0._0_8_;
        goto LAB_00103efd;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        this = (string *)&std::cin;
      }
      sptk::UniformQuantization::UniformQuantization
                ((UniformQuantization *)local_3e0,local_410,local_41c,local_418);
      if (local_3e0[0x18] != '\0') {
        goto LAB_00103c24;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Failed to initialize UniformQuantization",0x28);
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"quantize","");
      sptk::PrintErrorMessage(&local_408,(ostringstream *)local_3b0);
      goto LAB_00103ef8;
    }
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
    bVar1 = sptk::ConvertStringToInteger(&local_238,&local_41c);
    bVar2 = local_41c < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -b option must be a positive integer",
                 0x39);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"quantize","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_00103b7b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
  }
  if (iVar4 == 0x76) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
    bVar1 = sptk::ConvertStringToDouble(&local_238,&local_410);
    bVar2 = local_410 <= 0.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -v option must be a positive number",
                 0x38);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"quantize","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      goto LAB_00103b7b;
    }
    goto LAB_0010372f;
  }
  if (iVar4 != 0x6f) {
    if (iVar4 != 0x74) {
LAB_00103989:
      anon_unknown.dwarf_1ec7::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
    bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)local_3e0);
    if (bVar2) {
      bVar2 = sptk::IsInRange(local_3e0._0_4_,0,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar2) {
        local_418 = local_3e0._0_4_;
        goto LAB_0010372f;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"The argument for the -t option must be an integer ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"in the range of ",0x10);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
    std::ostream::operator<<((ostream *)poVar6,1);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"quantize","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    goto LAB_00103b7b;
  }
  std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
  bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)local_3e0);
  if (bVar2) {
    bVar2 = sptk::IsInRange(local_3e0._0_4_,0,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (bVar2) {
      local_3e8 = local_3e0._0_8_ & 0xffffffff;
      goto LAB_0010372f;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"in the range of ",0x10);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
  std::ostream::operator<<((ostream *)poVar6,1);
  local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"quantize","");
  sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
  goto LAB_00103b7b;
LAB_00103c24:
  bVar2 = sptk::ReadStream<double>(&local_3b8,(istream *)this);
  if (!bVar2) {
    iVar4 = 0;
    goto LAB_00103f2a;
  }
  bVar2 = sptk::UniformQuantization::Run((UniformQuantization *)local_3e0,local_3b8,&local_414);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Failed to quantize input",0x18);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"quantize","");
    sptk::PrintErrorMessage(&local_408,(ostringstream *)local_3b0);
    goto LAB_00103ef8;
  }
  if ((int)local_3e8 == 1) {
    local_414 = local_414 - (int)local_3e0._28_4_ / 2;
  }
  bVar2 = sptk::WriteStream<int>(local_414,(ostream *)&std::cout);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Failed to write a quantized sequence",0x24);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"quantize","");
    sptk::PrintErrorMessage(&local_408,(ostringstream *)local_3b0);
LAB_00103ef8:
    paVar8 = &local_408.field_2;
    _Var7._M_p = local_408._M_dataplus._M_p;
LAB_00103efd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar8) {
      operator_delete(_Var7._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    iVar4 = 1;
LAB_00103f2a:
    std::ifstream::~ifstream(&local_238);
    return iVar4;
  }
  goto LAB_00103c24;
}

Assistant:

int main(int argc, char* argv[]) {
  double absolute_maximum_value(kDefaultAbsoluteMaximumValue);
  int num_bit(kDefaultNumBit);
  sptk::UniformQuantization::QuantizationType quantization_type(
      kDefaultQuantizationType);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "v:b:t:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'v': {
        if (!sptk::ConvertStringToDouble(optarg, &absolute_maximum_value) ||
            absolute_maximum_value <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a positive number";
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        break;
      }
      case 'b': {
        if (!sptk::ConvertStringToInteger(optarg, &num_bit) || num_bit <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -b option must be a positive integer";
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::UniformQuantization::QuantizationType::
                                 kNumQuantizationTypes) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -t option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        quantization_type =
            static_cast<sptk::UniformQuantization::QuantizationType>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::UniformQuantization uniform_quantization(absolute_maximum_value,
                                                 num_bit, quantization_type);
  if (!uniform_quantization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize UniformQuantization";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }

  const int bias(-uniform_quantization.GetQuantizationLevels() / 2);
  double input;
  int output;

  while (sptk::ReadStream(&input, &input_stream)) {
    if (!uniform_quantization.Run(input, &output)) {
      std::ostringstream error_message;
      error_message << "Failed to quantize input";
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }

    if (kInteger == output_format) {
      output += bias;
    }

    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a quantized sequence";
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }
  }

  return 0;
}